

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_renegotiate(mbedtls_ssl_context *ssl)

{
  int iVar1;
  int line;
  char *text;
  
  if (ssl == (mbedtls_ssl_context *)0x0) {
    return -0x7100;
  }
  if (ssl->conf == (mbedtls_ssl_config *)0x0) {
    return -0x7100;
  }
  if ((ssl->conf->field_0x174 & 1) == 0) {
    if (ssl->renego_status == 1) {
      iVar1 = mbedtls_ssl_handshake(ssl);
      if (iVar1 == 0) {
        return 0;
      }
      text = "mbedtls_ssl_handshake";
      line = 0x1947;
    }
    else {
      if (ssl->state != 0x10) {
        return -0x7100;
      }
      iVar1 = ssl_start_renegotiation(ssl);
      if (iVar1 == 0) {
        return 0;
      }
      text = "ssl_start_renegotiation";
      line = 0x193f;
    }
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,line,text,iVar1);
    return iVar1;
  }
  if (ssl->state != 0x10) {
    return -0x7100;
  }
  ssl->renego_status = 3;
  if (ssl->out_left != 0) {
    iVar1 = mbedtls_ssl_flush_output(ssl);
    return iVar1;
  }
  iVar1 = ssl_write_hello_request(ssl);
  return iVar1;
}

Assistant:

int mbedtls_ssl_renegotiate( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

#if defined(MBEDTLS_SSL_SRV_C)
    /* On server, just send the request */
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
    {
        if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

        ssl->renego_status = MBEDTLS_SSL_RENEGOTIATION_PENDING;

        /* Did we already try/start sending HelloRequest? */
        if( ssl->out_left != 0 )
            return( mbedtls_ssl_flush_output( ssl ) );

        return( ssl_write_hello_request( ssl ) );
    }
#endif /* MBEDTLS_SSL_SRV_C */

#if defined(MBEDTLS_SSL_CLI_C)
    /*
     * On client, either start the renegotiation process or,
     * if already in progress, continue the handshake
     */
    if( ssl->renego_status != MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
    {
        if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

        if( ( ret = ssl_start_renegotiation( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_start_renegotiation", ret );
            return( ret );
        }
    }
    else
    {
        if( ( ret = mbedtls_ssl_handshake( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_handshake", ret );
            return( ret );
        }
    }
#endif /* MBEDTLS_SSL_CLI_C */

    return( ret );
}